

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

MESSENGER_SEND_EVENT_TASK * create_task(TELEMETRY_MESSENGER_INSTANCE_conflict *messenger)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MESSENGER_SEND_EVENT_TASK *task;
  TELEMETRY_MESSENGER_INSTANCE_conflict *messenger_local;
  
  l = (LOGGER_LOG)malloc(0x20);
  if ((MESSENGER_SEND_EVENT_TASK *)l == (MESSENGER_SEND_EVENT_TASK *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"create_task",0x3a2,1,"malloc of MESSENGER_SEND_EVENT_TASK failed");
    }
  }
  else {
    memset(l,0,0x20);
    ((MESSENGER_SEND_EVENT_TASK *)l)->messenger = messenger;
    ((MESSENGER_SEND_EVENT_TASK *)l)->send_time = -1;
    pSVar3 = singlylinkedlist_create();
    ((MESSENGER_SEND_EVENT_TASK *)l)->callback_list = pSVar3;
    if (pSVar3 == (SINGLYLINKEDLIST_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"create_task",0x3ab,1,"singlylinkedlist_create failed to create callback_list");
      }
      free_task((MESSENGER_SEND_EVENT_TASK *)l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      iVar1 = move_event_to_in_progress_list((MESSENGER_SEND_EVENT_TASK *)l);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"create_task",0x3b1,1,"move_event_to_in_progress_list failed");
        }
        free_task((MESSENGER_SEND_EVENT_TASK *)l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (MESSENGER_SEND_EVENT_TASK *)l;
}

Assistant:

static MESSENGER_SEND_EVENT_TASK* create_task(TELEMETRY_MESSENGER_INSTANCE *messenger)
{
    MESSENGER_SEND_EVENT_TASK* task = NULL;

    if (NULL == (task = (MESSENGER_SEND_EVENT_TASK *)malloc(sizeof(MESSENGER_SEND_EVENT_TASK))))
    {
        LogError("malloc of MESSENGER_SEND_EVENT_TASK failed");
    }
    else
    {
        memset(task, 0, sizeof(*task ));
        task->messenger = messenger;
        task->send_time = INDEFINITE_TIME;
        if (NULL == (task->callback_list = singlylinkedlist_create()))
        {
            LogError("singlylinkedlist_create failed to create callback_list");
            free_task(task);
            task = NULL;
        }
        else if (RESULT_OK != move_event_to_in_progress_list(task))
        {
            LogError("move_event_to_in_progress_list failed");
            free_task(task);
            task = NULL;
        }
    }
    return task;
}